

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

Builder * __thiscall arangodb::velocypack::Builder::operator=(Builder *this,Builder *that)

{
  bool bVar1;
  element_type *peVar2;
  uchar *puVar3;
  Builder *in_RSI;
  Builder *in_RDI;
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  *unaff_retaddr;
  size_type in_stack_00000018;
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  *in_stack_00000020;
  Builder *__x;
  
  if (in_RDI != in_RSI) {
    __x = in_RDI;
    std::shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_>::operator=
              (&in_RSI->_buffer,&in_RDI->_buffer);
    bVar1 = std::operator==(&in_RSI->_buffer,in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      in_RDI->_bufferPtr = in_RSI->_bufferPtr;
    }
    else {
      peVar2 = std::
               __shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
               ::get((__shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                      *)in_RDI);
      in_RDI->_bufferPtr = peVar2;
    }
    if (in_RDI->_bufferPtr == (Buffer<unsigned_char> *)0x0) {
      in_RDI->_start = (uint8_t *)0x0;
    }
    else {
      puVar3 = Buffer<unsigned_char>::data(in_RDI->_bufferPtr);
      in_RDI->_start = puVar3;
    }
    in_RDI->_pos = in_RSI->_pos;
    std::
    vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
    ::reserve(in_stack_00000020,in_stack_00000018);
    std::
    vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
    ::operator=(unaff_retaddr,
                (vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
                 *)__x);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)unaff_retaddr,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__x);
    in_RDI->_keyWritten = (bool)(in_RSI->_keyWritten & 1);
    in_RDI->options = in_RSI->options;
    in_RSI->_bufferPtr = (Buffer<unsigned_char> *)0x0;
    clear(in_RSI);
  }
  return in_RDI;
}

Assistant:

Builder& Builder::operator=(Builder&& that) noexcept {
  if (this != &that) {
    _buffer = std::move(that._buffer);
    if (_buffer != nullptr) {
      _bufferPtr = _buffer.get();
    } else {
      _bufferPtr = that._bufferPtr;
    }
    if (_bufferPtr != nullptr) {
      _start = _bufferPtr->data();
    } else {
      _start = nullptr;
    }
    _pos = that._pos;
    // do a full initial allocation in the arena, so we can maximize its usage
    _stack.reserve(arenaSize / sizeof(decltype(_stack)::value_type));
    _stack = std::move(that._stack);
    _indexes = std::move(that._indexes);
    _keyWritten = that._keyWritten;
    options = that.options;
    VELOCYPACK_ASSERT(that._buffer == nullptr);
    that._bufferPtr = nullptr;
    that.clear();
  }
  return *this;
}